

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RefCountedObject.h
# Opt level: O1

LineAndColumn __thiscall soul::CodeLocation::getLineAndColumn(CodeLocation *this)

{
  SourceCodeText *pSVar1;
  UnicodeChar UVar2;
  LineAndColumn LVar3;
  LineAndColumn LVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  UTF8Reader i;
  UTF8Reader local_30;
  
  pSVar1 = (this->sourceCode).object;
  if (pSVar1 == (SourceCodeText *)0x0) {
    LVar4.line = 0;
    LVar4.column = 0;
    return LVar4;
  }
  local_30.data = (pSVar1->utf8).data;
  if (local_30.data < (this->location).data) {
    uVar6 = 1;
    uVar5 = 1;
    do {
      if (*local_30.data == '\0') break;
      UVar2 = UTF8Reader::operator*(&local_30);
      uVar6 = uVar6 + 1;
      if (UVar2 == 10) {
        uVar6 = 1;
      }
      uVar5 = uVar5 + (UVar2 == 10);
      UTF8Reader::operator++(&local_30);
    } while (local_30.data < (this->location).data);
    LVar3.column = uVar6;
    LVar3.line = uVar5;
  }
  else {
    LVar3.line = 1;
    LVar3.column = 1;
  }
  return LVar3;
}

Assistant:

bool operator== (const ObjectType* other) const         { return object == other; }